

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

strong_ordering
QCborValueConstRef::compareThreeWay_helper(QCborValueConstRef lhs,QCborValueConstRef rhs)

{
  anon_union_8_2_4ee71171_for_Element_0 *paVar1;
  byte bVar2;
  int iVar3;
  long in_FS_OFFSET;
  anon_union_8_2_4ee71171_for_Element_0 local_28;
  anon_union_8_2_4ee71171_for_Element_0 aStack_20;
  anon_union_8_2_4ee71171_for_Element_0 local_18;
  anon_union_8_2_4ee71171_for_Element_0 aStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &((lhs.d)->elements).d.ptr[lhs.i].field_0;
  local_18 = *paVar1;
  aStack_10 = paVar1[1];
  paVar1 = &((rhs.d)->elements).d.ptr[rhs.i].field_0;
  local_28 = *paVar1;
  aStack_20 = paVar1[1];
  iVar3 = compareElementRecursive(lhs.d,(Element *)&local_18,rhs.d,(Element *)&local_28,ForOrdering)
  ;
  bVar2 = (byte)(iVar3 >> 0x1f) | 1;
  if (iVar3 == 0) {
    bVar2 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (strong_ordering)bVar2;
  }
  __stack_chk_fail();
}

Assistant:

Qt::strong_ordering
QCborValueConstRef::compareThreeWay_helper(QCborValueConstRef lhs, QCborValueConstRef rhs) noexcept
{
    QtCbor::Element e1 = lhs.d->elements.at(lhs.i);
    QtCbor::Element e2 = rhs.d->elements.at(rhs.i);
    int c = compareElementRecursive(lhs.d, e1, rhs.d, e2, Comparison::ForOrdering);
    return Qt::compareThreeWay(c, 0);
}